

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

bool tinyusdz::anon_unknown_240::HasReferencesRec
               (uint32_t depth,PrimSpec *primspec,uint32_t max_depth)

{
  PrimSpec *pPVar1;
  bool bVar2;
  PrimSpec *child;
  PrimSpec *primspec_00;
  
  if (max_depth < depth) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (primspec[0x2e8] == (PrimSpec)0x0) {
      primspec_00 = *(PrimSpec **)(primspec + 0x48);
      pPVar1 = *(PrimSpec **)(primspec + 0x50);
      if (primspec_00 == pPVar1) {
        bVar2 = false;
      }
      else {
        do {
          bVar2 = HasReferencesRec(depth + 1,primspec_00,max_depth);
          if (bVar2) {
            return bVar2;
          }
          primspec_00 = primspec_00 + 0x568;
        } while (primspec_00 != pPVar1);
      }
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool HasReferencesRec(uint32_t depth, const PrimSpec &primspec,
                      const uint32_t max_depth = 1024 * 128) {
  if (depth > max_depth) {
    // too deep
    return false;
  }

  if (primspec.metas().references) {
    return true;
  }

  for (auto &child : primspec.children()) {
    if (HasReferencesRec(depth + 1, child, max_depth)) {
      return true;
    }
  }

  return false;
}